

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakevfs.cpp
# Opt level: O1

int __thiscall QMakeVfs::idForFileName(QMakeVfs *this,QString *fn,VfsFlags flags)

{
  int iVar1;
  Node<QString,_int> *pNVar2;
  int *key;
  long in_FS_OFFSET;
  TryEmplaceResult local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (((uint)flags.super_QFlagsStorageHelper<QMakeVfs::VfsFlag,_4>.
             super_QFlagsStorage<QMakeVfs::VfsFlag>.i & 0x10) == 0) {
    QHash<QString,int>::tryEmplace_impl<QString_const&>(&local_38,&s_fileIdMap,fn);
    key = (int *)((local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].entries
                  [(local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].offsets
                   [(uint)local_38.iterator.i.bucket & 0x7f]].storage.data + 0x18);
    if (*key == 0) {
      LOCK();
      UNLOCK();
      iVar1 = (int)s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                   .super___atomic_base<int>._M_i + 1;
      s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (QAtomicInteger<int>)
           (QAtomicInteger<int>)
           ((int)s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + 1);
      *key = iVar1;
      QHash<int,QString>::tryEmplace_impl<int_const&>
                ((TryEmplaceResult *)&local_38,&s_idFileMap,key);
      QString::operator=((QString *)
                         ((local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].entries
                          [(local_38.iterator.i.d)->spans[local_38.iterator.i.bucket >> 7].offsets
                           [(uint)local_38.iterator.i.bucket & 0x7f]].storage.data + 8),
                         (QString *)fn);
    }
  }
  else {
    if (s_fileIdMap.d == (Data *)0x0) {
LAB_00291587:
      key = (int *)0x0;
    }
    else {
      pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_int>_>::findNode<QString>
                         (s_fileIdMap.d,fn);
      if (pNVar2 == (Node<QString,_int> *)0x0) goto LAB_00291587;
      key = &pNVar2->value;
    }
    if (key == (int *)0x0) {
      iVar1 = 0;
      goto LAB_00291592;
    }
  }
  iVar1 = *key;
LAB_00291592:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QMakeVfs::idForFileName(const QString &fn, VfsFlags flags)
{
#ifdef PROEVALUATOR_DUAL_VFS
    {
# ifdef PROPARSER_THREAD_SAFE
        QMutexLocker locker(&m_vmutex);
# endif
        int idx = (flags & VfsCumulative) ? 1 : 0;
        if (flags & VfsCreate) {
            int &id = m_virtualFileIdMap[idx][fn];
            if (!id) {
                id = ++s_fileIdCounter;
                m_virtualIdFileMap[id] = fn;
            }
            return id;
        }
        int id = m_virtualFileIdMap[idx].value(fn);
        if (id || (flags & VfsCreatedOnly))
            return id;
    }
#endif
#ifdef PROPARSER_THREAD_SAFE
    QMutexLocker locker(&s_mutex);
#endif
    if (!(flags & VfsAccessedOnly)) {
        int &id = s_fileIdMap[fn];
        if (!id) {
            id = ++s_fileIdCounter;
            s_idFileMap[id] = fn;
        }
        return id;
    }
    return s_fileIdMap.value(fn);
}